

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_SetIsInit(Pdr_Set_t *pCube,int iRemove)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if ((long)pCube->nLits <= (long)uVar2) {
      return 1;
    }
    if (*(int *)(&pCube->field_0x14 + uVar2 * 4) == -1) break;
    if (((uint)iRemove != uVar2) &&
       (iVar1 = Abc_LitIsCompl(*(int *)(&pCube->field_0x14 + uVar2 * 4)), iVar1 == 0)) {
      return 0;
    }
    uVar2 = uVar2 + 1;
  }
  __assert_fail("pCube->Lits[i] != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                ,0x1d1,"int Pdr_SetIsInit(Pdr_Set_t *, int)");
}

Assistant:

int Pdr_SetIsInit( Pdr_Set_t * pCube, int iRemove )
{
    int i;
    for ( i = 0; i < pCube->nLits; i++ )
    {
        assert( pCube->Lits[i] != -1 );
        if ( i == iRemove )
            continue;
        if ( Abc_LitIsCompl( pCube->Lits[i] ) == 0 )
            return 0;
    }
    return 1;
}